

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyHelpers.cpp
# Opt level: O3

void btSoftBodyHelpers::DrawFrame(btSoftBody *psb,btIDebugDraw *idraw)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  btVector3 *pbVar9;
  long lVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  btVector3 x;
  btVector3 com;
  btVector3 local_118;
  btVector3 local_108;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if ((psb->m_pose).m_bframe == true) {
    local_c8 = *(undefined8 *)(psb->m_pose).m_com.m_floats;
    uStack_c0 = *(undefined8 *)((psb->m_pose).m_com.m_floats + 2);
    fVar12 = (psb->m_pose).m_scl.m_el[0].m_floats[0];
    fVar13 = (psb->m_pose).m_scl.m_el[1].m_floats[0];
    fVar14 = (psb->m_pose).m_scl.m_el[2].m_floats[0];
    fVar15 = (psb->m_pose).m_scl.m_el[0].m_floats[1];
    fVar16 = (psb->m_pose).m_scl.m_el[1].m_floats[1];
    fVar17 = (psb->m_pose).m_rot.m_el[1].m_floats[1];
    fVar1 = (psb->m_pose).m_rot.m_el[0].m_floats[0];
    fVar2 = (psb->m_pose).m_rot.m_el[0].m_floats[1];
    fVar18 = (psb->m_pose).m_rot.m_el[0].m_floats[2];
    fVar3 = (psb->m_pose).m_rot.m_el[1].m_floats[0];
    fVar4 = (psb->m_pose).m_rot.m_el[1].m_floats[2];
    local_f8 = fVar14 * fVar18 + fVar12 * fVar1 + fVar2 * fVar13;
    fStack_f4 = fVar14 * fVar4 + fVar12 * fVar3 + fVar17 * fVar13;
    fStack_f0 = fVar14 * 0.0 + fVar12 * 0.0 + fVar13 * 0.0;
    fStack_ec = fVar14 * 0.0 + fVar12 * 0.0 + fVar13 * 0.0;
    fVar5 = (psb->m_pose).m_scl.m_el[2].m_floats[1];
    fVar6 = (psb->m_pose).m_scl.m_el[0].m_floats[2];
    fVar7 = (psb->m_pose).m_scl.m_el[1].m_floats[2];
    fVar8 = (psb->m_pose).m_scl.m_el[2].m_floats[2];
    local_d8 = fVar5 * fVar18 + fVar15 * fVar1 + fVar16 * fVar2;
    fStack_d4 = fVar4 * fVar5 + fVar3 * fVar15 + fVar17 * fVar16;
    uStack_d0 = 0;
    local_e8 = fVar8 * fVar18 + fVar6 * fVar1 + fVar7 * fVar2;
    fStack_e4 = fVar8 * fVar4 + fVar6 * fVar3 + fVar17 * fVar7;
    fStack_e0 = fVar8 * 0.0 + fVar6 * 0.0 + 0.0;
    fStack_dc = fVar8 * 0.0 + fVar6 * 0.0 + 0.0;
    fVar17 = (psb->m_pose).m_rot.m_el[2].m_floats[0];
    fVar1 = (psb->m_pose).m_rot.m_el[2].m_floats[1];
    fVar2 = (psb->m_pose).m_rot.m_el[2].m_floats[2];
    fVar18 = fVar14 * fVar2 + fVar12 * fVar17 + fVar13 * fVar1;
    fVar16 = fVar5 * fVar2 + fVar15 * fVar17 + fVar16 * fVar1;
    fVar17 = fVar8 * fVar2 + fVar6 * fVar17 + fVar7 * fVar1;
    fVar12 = fVar18 + fVar16 * 0.0 + fVar17 * 0.0;
    local_48 = ZEXT416((uint)fVar18);
    local_58 = ZEXT416((uint)fVar16);
    local_88 = ZEXT416((uint)(fVar18 * 0.0 + fVar16 + fVar17 * 0.0));
    local_78 = local_d8 * 0.0;
    fStack_74 = fStack_d4 * 0.0;
    uStack_70 = 0;
    local_a8 = local_e8 * 0.0;
    fStack_a4 = fStack_e4 * 0.0;
    fStack_a0 = fStack_e0 * 0.0;
    fStack_9c = fStack_dc * 0.0;
    fVar13 = local_f8 + local_78 + local_a8;
    fVar14 = fStack_f4 + fStack_74 + fStack_a4;
    fVar15 = 1.0 / SQRT(fVar12 * fVar12 + fVar13 * fVar13 + fVar14 * fVar14);
    local_108.m_floats[1] = (float)((ulong)local_c8 >> 0x20) + fVar15 * fVar14 * 10.0;
    local_108.m_floats[0] = (float)local_c8 + fVar15 * fVar13 * 10.0;
    local_108.m_floats[2] = fVar12 * fVar15 * 10.0 + (float)uStack_c0;
    local_108.m_floats[3] = 0.0;
    local_118.m_floats[0] = 1.0;
    local_118.m_floats[1] = 0.0;
    local_118.m_floats[2] = 0.0;
    local_118.m_floats[3] = 0.0;
    local_68 = ZEXT416((uint)fVar17);
    local_98 = ZEXT416((uint)(fVar18 * 0.0 + fVar16 * 0.0 + fVar17));
    (*idraw->_vptr_btIDebugDraw[4])(idraw,&local_c8,&local_108,&local_118);
    local_b8 = local_f8 * 0.0;
    fStack_b4 = fStack_f4 * 0.0;
    fStack_b0 = fStack_f0 * 0.0;
    fStack_ac = fStack_ec * 0.0;
    fVar12 = local_b8 + local_d8 + local_a8;
    fVar13 = fStack_b4 + fStack_d4 + fStack_a4;
    fVar14 = 1.0 / SQRT((float)local_88._0_4_ * (float)local_88._0_4_ +
                        fVar12 * fVar12 + fVar13 * fVar13);
    local_108.m_floats[1] = (float)((ulong)local_c8 >> 0x20) + fVar14 * fVar13 * 10.0;
    local_108.m_floats[0] = (float)local_c8 + fVar14 * fVar12 * 10.0;
    local_108.m_floats[2] = (float)local_88._0_4_ * fVar14 * 10.0 + (float)uStack_c0;
    local_108.m_floats[3] = 0.0;
    local_118.m_floats[0] = 0.0;
    local_118.m_floats[1] = 1.0;
    local_118.m_floats[2] = 0.0;
    local_118.m_floats[3] = 0.0;
    (*idraw->_vptr_btIDebugDraw[4])(idraw,&local_c8,&local_108,&local_118);
    fVar13 = local_b8 + local_78 + local_e8;
    fVar14 = fStack_b4 + fStack_74 + fStack_e4;
    fVar12 = 1.0 / SQRT((float)local_98._0_4_ * (float)local_98._0_4_ +
                        fVar13 * fVar13 + fVar14 * fVar14);
    local_108.m_floats[1] = (float)((ulong)local_c8 >> 0x20) + fVar12 * fVar14 * 10.0;
    local_108.m_floats[0] = (float)local_c8 + fVar12 * fVar13 * 10.0;
    local_108.m_floats[2] = (float)local_98._0_4_ * fVar12 * 10.0 + (float)uStack_c0;
    local_108.m_floats[3] = 0.0;
    local_118.m_floats[0] = 0.0;
    local_118.m_floats[1] = 0.0;
    local_118.m_floats[2] = 1.0;
    local_118.m_floats[3] = 0.0;
    (*idraw->_vptr_btIDebugDraw[4])(idraw,&local_c8,&local_108,&local_118);
    if (0 < (psb->m_pose).m_pos.m_size) {
      lVar11 = 8;
      lVar10 = 0;
      do {
        pbVar9 = (psb->m_pose).m_pos.m_data;
        fVar12 = *(float *)((long)pbVar9->m_floats + lVar11 + -8);
        fVar13 = *(float *)((long)pbVar9->m_floats + lVar11 + -4);
        fVar14 = *(float *)((long)pbVar9->m_floats + lVar11);
        local_108.m_floats[1] =
             (float)((ulong)local_c8 >> 0x20) +
             fVar14 * fStack_e4 + fVar12 * fStack_f4 + fVar13 * fStack_d4;
        local_108.m_floats[0] =
             (float)local_c8 + fVar14 * local_e8 + fVar12 * local_f8 + fVar13 * local_d8;
        local_108.m_floats[2] =
             (float)local_68._0_4_ * fVar14 +
             (float)local_48._0_4_ * fVar12 + (float)local_58._0_4_ * fVar13 + (float)uStack_c0;
        local_108.m_floats[3] = 0.0;
        local_118.m_floats[0] = 1.0;
        local_118.m_floats[1] = 0.0;
        local_118.m_floats[2] = 1.0;
        local_118.m_floats[3] = 0.0;
        drawVertex(idraw,&local_108,0.1,&local_118);
        lVar10 = lVar10 + 1;
        lVar11 = lVar11 + 0x10;
      } while (lVar10 < (psb->m_pose).m_pos.m_size);
    }
  }
  return;
}

Assistant:

void			btSoftBodyHelpers::DrawFrame(		btSoftBody* psb,
											 btIDebugDraw* idraw)
{
	if(psb->m_pose.m_bframe)
	{
		static const btScalar	ascl=10;
		static const btScalar	nscl=(btScalar)0.1;
		const btVector3			com=psb->m_pose.m_com;
		const btMatrix3x3		trs=psb->m_pose.m_rot*psb->m_pose.m_scl;
		const btVector3			Xaxis=(trs*btVector3(1,0,0)).normalized();
		const btVector3			Yaxis=(trs*btVector3(0,1,0)).normalized();
		const btVector3			Zaxis=(trs*btVector3(0,0,1)).normalized();
		idraw->drawLine(com,com+Xaxis*ascl,btVector3(1,0,0));
		idraw->drawLine(com,com+Yaxis*ascl,btVector3(0,1,0));
		idraw->drawLine(com,com+Zaxis*ascl,btVector3(0,0,1));
		for(int i=0;i<psb->m_pose.m_pos.size();++i)
		{
			const btVector3	x=com+trs*psb->m_pose.m_pos[i];
			drawVertex(idraw,x,nscl,btVector3(1,0,1));
		}
	}
}